

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  bool bVar1;
  BufHdr *pBVar2;
  EVP_PKEY_CTX *dst_00;
  EVP_PKEY_CTX *src_00;
  BufHdr *hdr;
  StringRef *in_stack_ffffffffffffffc8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffd0;
  int local_8;
  
  if (dst == (EVP_PKEY_CTX *)this) {
    local_8 = (int)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  }
  else {
    bVar1 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty
                      ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)dst);
    if (bVar1) {
      clear((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffffd0);
      local_8 = 0;
    }
    else {
      pBVar2 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getHdr
                         ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)dst);
      if (((pBVar2 != (BufHdr *)0x0) && ((pBVar2->m_flags & 4) == 0)) &&
         (bVar1 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isNullTerminated
                            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)dst), bVar1))
      {
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attach
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        local_8 = (int)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length
        ;
        return local_8;
      }
      dst_00 = (EVP_PKEY_CTX *)
               StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp
                         ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)dst);
      src_00 = (EVP_PKEY_CTX *)
               StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength
                         ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)dst);
      local_8 = copy(this,dst_00,src_00);
    }
  }
  return local_8;
}

Assistant:

size_t
	copy(const StringRef& src) {
		if (&src == this)
			return this->m_length;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		rc::BufHdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive) || !src.isNullTerminated())
			return copy(src.cp(), src.getLength());

		this->attach(src);
		return this->m_length;
	}